

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.c
# Opt level: O0

void free_exts(void)

{
  int local_c;
  int index;
  
  if (exts_i != (char **)0x0) {
    for (local_c = 0; local_c < num_exts_i; local_c = local_c + 1) {
      free(exts_i[local_c]);
    }
    free(exts_i);
    exts_i = (char **)0x0;
  }
  return;
}

Assistant:

static void free_exts(void) {
    if (exts_i != NULL) {
        int index;
        for(index = 0; index < num_exts_i; index++) {
            free((char *)exts_i[index]);
        }
        free((void *)exts_i);
        exts_i = NULL;
    }
}